

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

quint64 extendedPseudoClass(QWidget *w)

{
  bool bVar1;
  Orientation OVar2;
  QAbstractSlider *this;
  QComboBox *this_00;
  ulong uVar3;
  QLineEdit *this_01;
  QTextEdit *this_02;
  QPlainTextEdit *this_03;
  ulong uVar4;
  ulong uVar5;
  quint64 qVar6;
  
  uVar5 = (ulong)(((w->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i & 1) << 0xc);
  this = (QAbstractSlider *)QMetaObject::cast((QObject *)&QAbstractSlider::staticMetaObject);
  if (this == (QAbstractSlider *)0x0) {
    this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
    if (this_00 == (QComboBox *)0x0) {
      this_01 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
      if (this_01 == (QLineEdit *)0x0) {
        this_02 = (QTextEdit *)QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
        if (this_02 == (QTextEdit *)0x0) {
          this_03 = (QPlainTextEdit *)
                    QMetaObject::cast((QObject *)&QPlainTextEdit::staticMetaObject);
          if (this_03 == (QPlainTextEdit *)0x0) {
            return uVar5;
          }
          bVar1 = QPlainTextEdit::isReadOnly(this_03);
        }
        else {
          bVar1 = QTextEdit::isReadOnly(this_02);
        }
      }
      else {
        bVar1 = QLineEdit::isReadOnly(this_01);
      }
      uVar3 = 0x40000000;
      uVar4 = 0x8000000000;
    }
    else {
      bVar1 = QComboBox::isEditable(this_00);
      if (!bVar1) {
        return uVar5;
      }
      bVar1 = QComboBox::isEditable(this_00);
      uVar3 = 0x8000000000;
      uVar4 = 0x40000000;
    }
    if (bVar1 != false) {
      uVar4 = uVar3;
    }
    qVar6 = uVar5 | uVar4;
  }
  else {
    OVar2 = QAbstractSlider::orientation(this);
    qVar6 = uVar5 + (ulong)(OVar2 == Vertical) * 0x400 + 0x400;
  }
  return qVar6;
}

Assistant:

static quint64 extendedPseudoClass(const QWidget *w)
{
    quint64 pc = w->isWindow() ? quint64(PseudoClass_Window) : 0;
#if QT_CONFIG(abstractslider)
    if (const QAbstractSlider *slider = qobject_cast<const QAbstractSlider *>(w)) {
        pc |= ((slider->orientation() == Qt::Vertical) ? PseudoClass_Vertical : PseudoClass_Horizontal);
    } else
#endif
#if QT_CONFIG(combobox)
    if (const QComboBox *combo = qobject_cast<const QComboBox *>(w)) {
        if (combo->isEditable())
        pc |= (combo->isEditable() ? PseudoClass_Editable : PseudoClass_ReadOnly);
    } else
#endif
#if QT_CONFIG(lineedit)
    if (const QLineEdit *edit = qobject_cast<const QLineEdit *>(w)) {
        pc |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
    } else
#endif
#if QT_CONFIG(textedit)
    if (const QTextEdit *edit = qobject_cast<const QTextEdit *>(w)) {
        pc |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
    } else
    if (const QPlainTextEdit *edit = qobject_cast<const QPlainTextEdit *>(w)) {
        pc |= (edit->isReadOnly() ? PseudoClass_ReadOnly : PseudoClass_Editable);
    } else
#endif
    {}
    return pc;
}